

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int *key)

{
  int *piVar1;
  uint64_t *puVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar5 = upper_bound<int>(this,key);
  iVar9 = 0;
  if (uVar5 != 0) {
    piVar1 = this->key_slots_;
    iVar9 = 0;
    if (*key == piVar1[(long)(int)uVar5 + -1]) {
      iVar6 = 0x7fffffff;
      if (uVar5 != this->data_capacity_) {
        iVar6 = piVar1[(int)uVar5];
      }
      if ((int)uVar5 < 1) {
        iVar9 = 0;
      }
      else {
        puVar2 = this->bitmap_;
        iVar9 = 0;
        uVar7 = (ulong)uVar5;
        do {
          if (*key != piVar1[uVar7 - 1]) break;
          piVar1[uVar7 - 1] = iVar6;
          if ((long)this->data_capacity_ < (long)uVar7) {
            __assert_fail("pos >= 0 && pos < data_capacity_",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                          ,0x1dc,
                          "bool alex::AlexDataNode<int, int>::check_exists(int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                         );
          }
          uVar8 = uVar7 - 1;
          uVar10 = uVar8 >> 6 & 0x3ffffff;
          uVar3 = puVar2[uVar10];
          iVar9 = iVar9 + (uint)((uVar3 >> (uVar8 & 0x3f) & 1) != 0);
          puVar2[uVar10] = uVar3 & ~(1L << (uVar8 & 0x3f));
          bVar4 = 1 < uVar7;
          uVar7 = uVar8;
        } while (bVar4);
      }
      iVar6 = this->num_keys_ - iVar9;
      this->num_keys_ = iVar6;
      if ((double)iVar6 < this->contraction_threshold_) {
        resize(this,0.8,false,false,false);
        this->num_resizes_ = this->num_resizes_ + 1;
      }
    }
  }
  return iVar9;
}

Assistant:

int erase(const T& key) {
    int pos = upper_bound(key);

    if (pos == 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos - 1), key)) return 0;

    // Erase preceding positions until we reach a key with smaller value
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 && key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }